

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::declare_temporary_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,uint32_t result_id
          )

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  ulong uVar1;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar2;
  size_t sVar3;
  SPIRType *type;
  size_type sVar4;
  mapped_type *name;
  Bitset *flags;
  SPIRBlock *pSVar5;
  char (*pacVar6) [4];
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar7;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar8;
  long lVar9;
  __hashtable *__h;
  __node_gen_type __node_gen;
  ID local_94;
  string local_90;
  __node_base local_70 [2];
  _Hash_node_base local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_94.id = result_id;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    result_type);
  if ((this->block_temporary_hoisting == false) &&
     (this->current_continue_block != (SPIRBlock *)0x0)) {
    this_00 = &(this->super_Compiler).hoisted_temporaries;
    sVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,&local_94.id);
    if (sVar4 == 0) {
      pSVar5 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (this->current_continue_block->loop_dominator).id);
      ppVar7 = (pSVar5->declare_temporary).
               super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
               .ptr;
      uVar1 = (pSVar5->declare_temporary).
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              .buffer_size;
      ppVar2 = ppVar7 + uVar1;
      ppVar8 = ppVar7;
      if (0 < (long)uVar1 >> 2) {
        ppVar8 = ppVar7 + (uVar1 & 0xfffffffffffffffc);
        lVar9 = ((long)uVar1 >> 2) + 1;
        ppVar7 = ppVar7 + 2;
        do {
          if ((ppVar7[-2].first.id == result_type) && (ppVar7[-2].second.id == local_94.id)) {
            ppVar7 = ppVar7 + -2;
            goto LAB_001fba75;
          }
          if ((ppVar7[-1].first.id == result_type) && (ppVar7[-1].second.id == local_94.id)) {
            ppVar7 = ppVar7 + -1;
            goto LAB_001fba75;
          }
          if (((ppVar7->first).id == result_type) && ((ppVar7->second).id == local_94.id))
          goto LAB_001fba75;
          if ((ppVar7[1].first.id == result_type) && (ppVar7[1].second.id == local_94.id)) {
            ppVar7 = ppVar7 + 1;
            goto LAB_001fba75;
          }
          lVar9 = lVar9 + -1;
          ppVar7 = ppVar7 + 4;
        } while (1 < lVar9);
      }
      lVar9 = (long)ppVar2 - (long)ppVar8 >> 3;
      if (lVar9 == 1) {
LAB_001fba63:
        ppVar7 = ppVar2;
        if (((ppVar8->first).id == result_type) &&
           (ppVar7 = ppVar8, (ppVar8->second).id != local_94.id)) {
          ppVar7 = ppVar2;
        }
      }
      else {
        ppVar7 = ppVar8;
        if (lVar9 == 2) {
LAB_001fba3f:
          if (((ppVar7->first).id != result_type) || ((ppVar7->second).id != local_94.id)) {
            ppVar8 = ppVar7 + 1;
            goto LAB_001fba63;
          }
        }
        else {
          ppVar7 = ppVar2;
          if ((lVar9 == 3) &&
             (((ppVar8->first).id != result_type ||
              (ppVar7 = ppVar8, (ppVar8->second).id != local_94.id)))) {
            ppVar7 = ppVar8 + 1;
            goto LAB_001fba3f;
          }
        }
      }
LAB_001fba75:
      if (ppVar7 == ppVar2) {
        SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
        ::reserve(&pSVar5->declare_temporary,uVar1 + 1);
        ppVar2 = (pSVar5->declare_temporary).
                 super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                 .ptr;
        sVar3 = (pSVar5->declare_temporary).
                super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                .buffer_size;
        ppVar2[sVar3].first.id = result_type;
        ppVar2[sVar3].second.id = local_94.id;
        (pSVar5->declare_temporary).
        super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
        .buffer_size = sVar3 + 1;
        local_90._M_dataplus._M_p = (pointer)this_00;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00);
        Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
      }
      pacVar6 = (char (*) [4])0x1;
      (*(this->super_Compiler)._vptr_Compiler[6])(&local_90,this,(ulong)local_94.id);
      join<std::__cxx11::string,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d8ee,
                 pacVar6);
      goto LAB_001fbaf9;
    }
  }
  sVar4 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->super_Compiler).hoisted_temporaries._M_h,&local_94.id);
  if (sVar4 == 0) {
    local_90._M_dataplus._M_p._0_4_ = local_94.id;
    name = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,(key_type *)&local_90);
    add_variable(this,&this->local_variable_names,&this->block_names,(string *)name);
    flags = Compiler::get_decoration_bitset(&this->super_Compiler,local_94);
    flags_to_qualifiers_glsl_abi_cxx11_(&local_90,this,type,flags);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_70,this,(ulong)local_94.id,1);
    pacVar6 = (char (*) [4])0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_50,this,type,local_70);
    join<std::__cxx11::string,std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)&local_90,&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d8ee,pacVar6
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70[0]._M_nxt != local_60) {
      operator_delete(local_70[0]._M_nxt);
    }
  }
  else {
    pacVar6 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])(&local_90,this,(ulong)local_94.id);
    join<std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d8ee,pacVar6
              );
  }
LAB_001fbaf9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::declare_temporary(uint32_t result_type, uint32_t result_id)
{
	auto &type = get<SPIRType>(result_type);

	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (!block_temporary_hoisting && current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile_guarantee_forward_progress();
		}

		return join(to_name(result_id), " = ");
	}
	else if (hoisted_temporaries.count(result_id))
	{
		// The temporary has already been declared earlier, so just "declare" the temporary by writing to it.
		return join(to_name(result_id), " = ");
	}
	else
	{
		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);
		auto &flags = get_decoration_bitset(result_id);
		return join(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), " = ");
	}
}